

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AppendFlagEscape(cmLocalGenerator *this,string *flags,string *rawFlag)

{
  pointer pcVar1;
  size_type sVar2;
  bool unescapeNinjaConfiguration;
  string_view str;
  string local_50;
  
  pcVar1 = (rawFlag->_M_dataplus)._M_p;
  sVar2 = rawFlag->_M_string_length;
  unescapeNinjaConfiguration = IsNinjaMulti(this);
  str._M_str = pcVar1;
  str._M_len = sVar2;
  cmOutputConverter::EscapeForShell_abi_cxx11_
            (&local_50,&this->super_cmOutputConverter,str,false,false,false,
             unescapeNinjaConfiguration,false);
  (*this->_vptr_cmLocalGenerator[6])(this,flags,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmLocalGenerator::AppendFlagEscape(std::string& flags,
                                        const std::string& rawFlag) const
{
  this->AppendFlags(
    flags,
    this->EscapeForShell(rawFlag, false, false, false, this->IsNinjaMulti()));
}